

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

void __thiscall
Js::JavascriptProxy::JavascriptProxy
          (JavascriptProxy *this,DynamicType *type,ScriptContext *scriptContext,
          RecyclableObject *target,RecyclableObject *handler)

{
  RecyclableObject *handler_local;
  RecyclableObject *target_local;
  ScriptContext *scriptContext_local;
  DynamicType *type_local;
  JavascriptProxy *this_local;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e3b9b0;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->handler,handler);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->target,target);
  Js::Type::SetHasSpecialPrototype(&type->super_Type,true);
  return;
}

Assistant:

JavascriptProxy::JavascriptProxy(DynamicType * type, ScriptContext * scriptContext, RecyclableObject* target, RecyclableObject* handler) :
        DynamicObject(type),
        handler(handler),
        target(target)
    {
        type->SetHasSpecialPrototype(true);
    }